

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void * __thiscall
ObjectBlockPool<32,_2048>::GetBasePointer(ObjectBlockPool<32,_2048> *this,void *ptr)

{
  LargeBlock<32,_2048> *pLVar1;
  uint uVar2;
  ulong uVar3;
  uintptr_t fromBase;
  MyLargeBlock *best;
  uint local_28;
  uint pointer;
  uint upperBound;
  uint lowerBound;
  void *ptr_local;
  ObjectBlockPool<32,_2048> *this_local;
  
  if ((((this->sortedPages).count == 0) || (ptr < *(this->sortedPages).data)) ||
     ((this->sortedPages).data[(this->sortedPages).count - 1] + 1 < ptr)) {
    this_local = (ObjectBlockPool<32,_2048> *)0x0;
  }
  else {
    pointer = 0;
    best._4_4_ = 0;
    uVar2 = (this->sortedPages).count - 1;
    while (local_28 = uVar2, 1 < local_28 - pointer) {
      best._4_4_ = pointer + local_28 >> 1;
      uVar2 = best._4_4_;
      if (((this->sortedPages).data[best._4_4_] <= ptr) &&
         (uVar2 = local_28, (this->sortedPages).data[best._4_4_] < ptr)) {
        pointer = best._4_4_;
      }
    }
    if (ptr < (this->sortedPages).data[best._4_4_]) {
      best._4_4_ = best._4_4_ - 1;
    }
    else if ((this->sortedPages).data[best._4_4_] + 1 < ptr) {
      best._4_4_ = best._4_4_ + 1;
    }
    pLVar1 = (this->sortedPages).data[best._4_4_];
    uVar3 = (long)ptr - (long)pLVar1->page;
    if (uVar3 < 0x10001) {
      this_local = (ObjectBlockPool<32,_2048> *)
                   ((long)pLVar1->page + (ulong)((uint)uVar3 & 0xffffffe0) + 8);
    }
    else {
      this_local = (ObjectBlockPool<32,_2048> *)0x0;
    }
  }
  return this_local;
}

Assistant:

void* GetBasePointer(void* ptr)
	{
		if(sortedPages.count == 0 || ptr < sortedPages.data[0] || ptr > (char*)sortedPages.data[sortedPages.count - 1] + sizeof(MyLargeBlock))
			return NULL;

		// Binary search
		unsigned lowerBound = 0;
		unsigned upperBound = sortedPages.count - 1;
		unsigned pointer = 0;

		while(upperBound - lowerBound > 1)
		{
			pointer = (lowerBound + upperBound) >> 1;

			if(ptr < sortedPages.data[pointer])
				upperBound = pointer;
			else if(ptr > sortedPages.data[pointer])
				lowerBound = pointer;
		}

		if(ptr < sortedPages.data[pointer])
			pointer--;
		else if(ptr > (char*)sortedPages.data[pointer] + sizeof(MyLargeBlock))
			pointer++;

		MyLargeBlock *best = sortedPages.data[pointer];

		uintptr_t fromBase = (uintptr_t)((char*)ptr - (char*)best->page);

		if(fromBase > sizeof(best->page))
			return NULL;

		return (char*)best->page + (unsigned(fromBase) & ~(elemSize - 1)) + sizeof(markerType);
	}